

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_avx2.c
# Opt level: O0

void pack_8x9_init(uint16_t *src,ptrdiff_t pitch,__m256i *sig)

{
  undefined1 (*pauVar1) [16];
  undefined1 auVar2 [32];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 (*in_RDX) [32];
  long in_RSI;
  undefined1 (*in_RDI) [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  __m256i s6;
  __m256i s5;
  __m256i s4;
  __m256i s3;
  __m256i s2;
  __m256i s1;
  __m256i s0;
  undefined1 local_420 [16];
  undefined1 auStack_410 [16];
  undefined1 local_400 [16];
  undefined1 auStack_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 auStack_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 auStack_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 auStack_390 [16];
  undefined1 local_380 [16];
  undefined1 auStack_370 [16];
  
  auStack_370._0_8_ = in_XMM1_Qa;
  auStack_370._8_8_ = in_XMM1_Qb;
  auVar17 = *(undefined1 (*) [16])(*in_RDI + in_RSI * 2);
  auStack_390._0_8_ = in_XMM1_Qa;
  auStack_390._8_8_ = in_XMM1_Qb;
  auVar18 = *(undefined1 (*) [16])(*in_RDI + in_RSI * 4);
  auStack_3b0._0_8_ = in_XMM1_Qa;
  auStack_3b0._8_8_ = in_XMM1_Qb;
  auVar19 = *(undefined1 (*) [16])(*in_RDI + in_RSI * 6);
  auStack_3d0._0_8_ = in_XMM1_Qa;
  auStack_3d0._8_8_ = in_XMM1_Qb;
  auVar20 = *(undefined1 (*) [16])(*in_RDI + in_RSI * 8);
  auStack_3f0._0_8_ = in_XMM1_Qa;
  auStack_3f0._8_8_ = in_XMM1_Qb;
  auVar21 = *(undefined1 (*) [16])(*in_RDI + in_RSI * 10);
  auStack_410._0_8_ = in_XMM1_Qa;
  auStack_410._8_8_ = in_XMM1_Qb;
  pauVar1 = (undefined1 (*) [16])(*in_RDI + in_RSI * 0xc);
  uVar3 = *(undefined8 *)*pauVar1;
  uVar4 = *(undefined8 *)(*pauVar1 + 8);
  auVar16 = ZEXT116(0) * auVar17 + ZEXT116(1) * *in_RDI;
  auVar22 = ZEXT116(0) * auStack_370 + ZEXT116(1) * auVar17;
  auVar17 = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar17;
  auVar23 = ZEXT116(0) * auStack_390 + ZEXT116(1) * auVar18;
  auVar18 = ZEXT116(0) * auVar19 + ZEXT116(1) * auVar18;
  auVar24 = ZEXT116(0) * auStack_3b0 + ZEXT116(1) * auVar19;
  auVar19 = ZEXT116(0) * auVar20 + ZEXT116(1) * auVar19;
  auVar25 = ZEXT116(0) * auStack_3d0 + ZEXT116(1) * auVar20;
  auVar20 = ZEXT116(0) * auVar21 + ZEXT116(1) * auVar20;
  auVar26 = ZEXT116(0) * auStack_3f0 + ZEXT116(1) * auVar21;
  auVar21 = ZEXT116(0) * *pauVar1 + ZEXT116(1) * auVar21;
  auVar27 = ZEXT116(0) * auStack_410 + ZEXT116(1) * *pauVar1;
  auStack_370._0_8_ = auVar22._0_8_;
  auStack_370._8_8_ = auVar22._8_8_;
  auStack_390._0_8_ = auVar23._0_8_;
  auStack_390._8_8_ = auVar23._8_8_;
  auVar9._16_8_ = auStack_370._0_8_;
  auVar9._0_16_ = auVar16;
  auVar9._24_8_ = auStack_370._8_8_;
  auVar8._16_8_ = auStack_390._0_8_;
  auVar8._0_16_ = auVar17;
  auVar8._24_8_ = auStack_390._8_8_;
  auVar2 = vpunpcklwd_avx2(auVar9,auVar8);
  *in_RDX = auVar2;
  auVar15._16_8_ = auStack_370._0_8_;
  auVar15._0_16_ = auVar16;
  auVar15._24_8_ = auStack_370._8_8_;
  auVar14._16_8_ = auStack_390._0_8_;
  auVar14._0_16_ = auVar17;
  auVar14._24_8_ = auStack_390._8_8_;
  auVar2 = vpunpckhwd_avx2(auVar15,auVar14);
  in_RDX[4] = auVar2;
  auStack_3b0._0_8_ = auVar24._0_8_;
  auStack_3b0._8_8_ = auVar24._8_8_;
  auStack_3d0._0_8_ = auVar25._0_8_;
  auStack_3d0._8_8_ = auVar25._8_8_;
  auVar7._16_8_ = auStack_3b0._0_8_;
  auVar7._0_16_ = auVar18;
  auVar7._24_8_ = auStack_3b0._8_8_;
  auVar6._16_8_ = auStack_3d0._0_8_;
  auVar6._0_16_ = auVar19;
  auVar6._24_8_ = auStack_3d0._8_8_;
  auVar2 = vpunpcklwd_avx2(auVar7,auVar6);
  in_RDX[1] = auVar2;
  auVar13._16_8_ = auStack_3b0._0_8_;
  auVar13._0_16_ = auVar18;
  auVar13._24_8_ = auStack_3b0._8_8_;
  auVar12._16_8_ = auStack_3d0._0_8_;
  auVar12._0_16_ = auVar19;
  auVar12._24_8_ = auStack_3d0._8_8_;
  auVar2 = vpunpckhwd_avx2(auVar13,auVar12);
  in_RDX[5] = auVar2;
  auStack_3f0._0_8_ = auVar26._0_8_;
  auStack_3f0._8_8_ = auVar26._8_8_;
  auStack_410._0_8_ = auVar27._0_8_;
  auStack_410._8_8_ = auVar27._8_8_;
  auVar5._16_8_ = auStack_3f0._0_8_;
  auVar5._0_16_ = auVar20;
  auVar5._24_8_ = auStack_3f0._8_8_;
  auVar2._16_8_ = auStack_410._0_8_;
  auVar2._0_16_ = auVar21;
  auVar2._24_8_ = auStack_410._8_8_;
  auVar2 = vpunpcklwd_avx2(auVar5,auVar2);
  in_RDX[2] = auVar2;
  auVar11._16_8_ = auStack_3f0._0_8_;
  auVar11._0_16_ = auVar20;
  auVar11._24_8_ = auStack_3f0._8_8_;
  auVar10._16_8_ = auStack_410._0_8_;
  auVar10._0_16_ = auVar21;
  auVar10._24_8_ = auStack_410._8_8_;
  auVar2 = vpunpckhwd_avx2(auVar11,auVar10);
  in_RDX[6] = auVar2;
  *(undefined8 *)in_RDX[8] = uVar3;
  *(undefined8 *)(in_RDX[8] + 8) = uVar4;
  *(undefined8 *)(in_RDX[8] + 0x10) = in_XMM1_Qa;
  *(undefined8 *)(in_RDX[8] + 0x18) = in_XMM1_Qb;
  return;
}

Assistant:

static void pack_8x9_init(const uint16_t *src, ptrdiff_t pitch, __m256i *sig) {
  __m256i s0 = _mm256_castsi128_si256(_mm_loadu_si128((const __m128i *)src));
  __m256i s1 =
      _mm256_castsi128_si256(_mm_loadu_si128((const __m128i *)(src + pitch)));
  __m256i s2 = _mm256_castsi128_si256(
      _mm_loadu_si128((const __m128i *)(src + 2 * pitch)));
  __m256i s3 = _mm256_castsi128_si256(
      _mm_loadu_si128((const __m128i *)(src + 3 * pitch)));
  __m256i s4 = _mm256_castsi128_si256(
      _mm_loadu_si128((const __m128i *)(src + 4 * pitch)));
  __m256i s5 = _mm256_castsi128_si256(
      _mm_loadu_si128((const __m128i *)(src + 5 * pitch)));
  __m256i s6 = _mm256_castsi128_si256(
      _mm_loadu_si128((const __m128i *)(src + 6 * pitch)));

  s0 = _mm256_inserti128_si256(s0, _mm256_castsi256_si128(s1), 1);
  s1 = _mm256_inserti128_si256(s1, _mm256_castsi256_si128(s2), 1);
  s2 = _mm256_inserti128_si256(s2, _mm256_castsi256_si128(s3), 1);
  s3 = _mm256_inserti128_si256(s3, _mm256_castsi256_si128(s4), 1);
  s4 = _mm256_inserti128_si256(s4, _mm256_castsi256_si128(s5), 1);
  s5 = _mm256_inserti128_si256(s5, _mm256_castsi256_si128(s6), 1);

  sig[0] = _mm256_unpacklo_epi16(s0, s1);
  sig[4] = _mm256_unpackhi_epi16(s0, s1);
  sig[1] = _mm256_unpacklo_epi16(s2, s3);
  sig[5] = _mm256_unpackhi_epi16(s2, s3);
  sig[2] = _mm256_unpacklo_epi16(s4, s5);
  sig[6] = _mm256_unpackhi_epi16(s4, s5);
  sig[8] = s6;
}